

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

SNode * add_SNode(Parser *p,D_State *state,d_loc_t *loc,D_Scope *sc)

{
  Shift *pSVar1;
  D_Reduction *reduction;
  SNode *sn;
  Shift *pSVar2;
  Shift **ppSVar3;
  ulong uVar4;
  
  sn = find_SNode(p,(uint)(((long)state - (long)p->t->state) / 0x78),sc);
  if (sn == (SNode *)0x0) {
    sn = new_SNode(p,state,loc,sc);
    if (sn->state->shifts != 0) {
      pSVar2 = p->free_shifts;
      if (pSVar2 == (Shift *)0x0) {
        pSVar2 = (Shift *)malloc(0x10);
      }
      else {
        p->free_shifts = pSVar2->next;
      }
      ppSVar3 = &p->shifts_todo;
      pSVar2->snode = sn;
      sn->refcount = sn->refcount + 1;
      while ((pSVar1 = *ppSVar3, pSVar1 != (Shift *)0x0 && ((pSVar1->snode->loc).s < (sn->loc).s)))
      {
        ppSVar3 = &pSVar1->next;
      }
      pSVar2->next = pSVar1;
      *ppSVar3 = pSVar2;
    }
    for (uVar4 = 0; uVar4 < (sn->state->reductions).n; uVar4 = uVar4 + 1) {
      reduction = (sn->state->reductions).v[uVar4];
      if (reduction->nelements == 0) {
        add_Reduction(p,(ZNode *)0x0,sn,reduction);
      }
    }
  }
  return sn;
}

Assistant:

static SNode *add_SNode(Parser *p, D_State *state, d_loc_t *loc, D_Scope *sc) {
  uint i;
  SNode *sn = find_SNode(p, state - p->t->state, sc);
  if (sn) return sn;
  sn = new_SNode(p, state, loc, sc);
  if (sn->state->shifts) add_Shift(p, sn);
  for (i = 0; i < sn->state->reductions.n; i++)
    if (!sn->state->reductions.v[i]->nelements) add_Reduction(p, 0, sn, sn->state->reductions.v[i]);
  return sn;
}